

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  undefined4 local_50;
  char *local_48;
  int local_3c;
  char *local_38;
  
  if (argc != 1) {
    pcVar1 = argv[1];
    iVar7 = strcmp(pcVar1,"-h");
    if ((iVar7 != 0) && (iVar7 = strcmp(pcVar1,"--help"), iVar7 != 0)) {
      iVar7 = strcmp(pcVar1,"-v");
      if ((iVar7 == 0) || (iVar7 = strcmp(pcVar1,"--version"), iVar7 == 0)) {
        print_version();
        goto LAB_0010960f;
      }
      if ((argc < 3) || (iVar7 = strcmp(pcVar1,"-D"), iVar7 != 0)) {
        iVar7 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
        lVar14 = 1;
        if (iVar7 == 0) goto LAB_001087ef;
LAB_0010961b:
        main_cold_1();
LAB_00109620:
        main_cold_23();
LAB_00109625:
        main_cold_19();
LAB_0010962a:
        main_cold_11();
LAB_0010962f:
        main_cold_22();
LAB_00109634:
        main_cold_6();
LAB_00109639:
        main_cold_14();
LAB_0010963e:
        main_cold_15();
LAB_00109643:
        main_cold_7();
LAB_00109648:
        main_cold_17();
LAB_0010964d:
        main_cold_10();
LAB_00109652:
        main_cold_20();
LAB_00109657:
        main_cold_2();
LAB_0010965c:
        main_cold_4();
LAB_00109661:
        main_cold_18();
LAB_00109666:
        main_cold_12();
LAB_0010966b:
        main_cold_5();
LAB_00109670:
        main_cold_8();
      }
      else {
        coda_set_definition_path(argv[2]);
        lVar14 = 3;
LAB_001087ef:
        iVar12 = (int)lVar14;
        pcVar1 = argv[lVar14];
        iVar7 = strcmp(pcVar1,"list");
        if (iVar7 == 0) {
          bVar15 = false;
          run_mode = RUN_MODE_LIST;
          uVar13 = iVar12 + 1;
          traverse_info.file_name = (char *)0x0;
          traverse_info.filter[0] = (codadump_filter *)0x0;
          verbosity = 1;
          calc_dim = 0;
          show_dim_vals = 0;
          show_type = 0;
          show_unit = 0;
          show_description = 0;
          iVar7 = argc - uVar13;
          if (iVar7 == 0 || argc < (int)uVar13) {
            local_50 = 1;
          }
          else {
            iVar12 = 0;
            local_50 = 1;
            bVar15 = true;
            do {
              pcVar1 = argv[(ulong)uVar13 + (long)iVar12];
              iVar8 = strcmp(pcVar1,"-c");
              if ((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--calc_dim"), iVar8 == 0)) {
                calc_dim = 1;
                pcVar1 = traverse_info.file_name;
              }
              else {
                iVar8 = strcmp(pcVar1,"-d");
                if ((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--disable_conversions"), iVar8 == 0)) {
                  local_50 = 0;
                  pcVar1 = traverse_info.file_name;
                }
                else {
                  iVar8 = strcmp(pcVar1,"-f");
                  if ((((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--filter"), iVar8 == 0)) &&
                      (iVar8 = iVar12 + 1, iVar8 < iVar7)) &&
                     (*argv[(ulong)uVar13 + (long)iVar8] != '-')) {
                    traverse_info.filter[0] =
                         codadump_filter_create(argv[(ulong)uVar13 + (long)iVar8]);
                    pcVar1 = traverse_info.file_name;
                    iVar12 = iVar8;
                    if (traverse_info.filter[0] == (codadump_filter *)0x0) goto LAB_00109652;
                  }
                  else {
                    iVar8 = strcmp(pcVar1,"-t");
                    if ((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--type"), iVar8 == 0)) {
                      show_type = 1;
                      pcVar1 = traverse_info.file_name;
                    }
                    else {
                      iVar8 = strcmp(pcVar1,"-u");
                      if ((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--unit"), iVar8 == 0)) {
                        show_unit = 1;
                        pcVar1 = traverse_info.file_name;
                      }
                      else {
                        iVar8 = strcmp(pcVar1,"--description");
                        if (iVar8 == 0) {
                          show_description = 1;
                          pcVar1 = traverse_info.file_name;
                        }
                        else {
                          iVar8 = strcmp(pcVar1,"--dim_values");
                          if (iVar8 == 0) {
                            calc_dim = 1;
                            show_dim_vals = 1;
                            pcVar1 = traverse_info.file_name;
                          }
                          else {
                            iVar8 = strcmp(pcVar1,"--no_special_types");
                            if (iVar8 == 0) {
                              bVar15 = false;
                              pcVar1 = traverse_info.file_name;
                            }
                            else if ((iVar12 != iVar7 + -1) || (*pcVar1 == '-')) goto LAB_0010967a;
                          }
                        }
                      }
                    }
                  }
                }
              }
              traverse_info.file_name = pcVar1;
              iVar12 = iVar12 + 1;
            } while (iVar12 < iVar7);
            bVar15 = !bVar15;
          }
          if ((traverse_info.file_name == (char *)0x0) || (*traverse_info.file_name == '\0'))
          goto LAB_00109620;
          iVar7 = coda_init();
          if (iVar7 == 0) {
            coda_set_option_bypass_special_types(bVar15);
            coda_set_option_perform_boundary_checks(0);
            coda_set_option_perform_conversions(local_50);
            traverse_info_init();
            dim_info_init();
            traverse_product();
LAB_0010927d:
            dim_info_done();
            traverse_info_done();
LAB_001095ed:
            coda_done();
            return 0;
          }
          goto LAB_0010962f;
        }
        iVar7 = strcmp(pcVar1,"ascii");
        if (iVar7 == 0) {
          uVar11 = 1;
          run_mode = RUN_MODE_ASCII;
          uVar13 = iVar12 + 1;
          bVar15 = false;
          traverse_info.file_name = (char *)0x0;
          traverse_info.filter[0] = (codadump_filter *)0x0;
          output_file_name = (char *)0x0;
          ascii_col_sep = " ";
          ascii_output = _stdout;
          verbosity = 1;
          calc_dim = 1;
          show_index = 0;
          show_label = 0;
          show_quotes = 0;
          show_time_as_string = 0;
          iVar7 = argc - uVar13;
          if (iVar7 != 0 && (int)uVar13 <= argc) {
            iVar12 = 0;
            bVar15 = true;
            do {
              pcVar1 = argv[(ulong)uVar13 + (long)iVar12];
              iVar8 = strcmp(pcVar1,"-d");
              if ((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--disable_conversions"), iVar8 == 0)) {
                uVar11 = 0;
                pcVar4 = traverse_info.file_name;
                pcVar5 = ascii_col_sep;
                pcVar6 = output_file_name;
                iVar8 = iVar12;
              }
              else {
                iVar8 = strcmp(pcVar1,"-f");
                if ((((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--filter"), iVar8 == 0)) &&
                    (iVar8 = iVar12 + 1, iVar8 < iVar7)) &&
                   (*argv[(ulong)uVar13 + (long)iVar8] != '-')) {
                  traverse_info.filter[0] =
                       codadump_filter_create(argv[(ulong)uVar13 + (long)iVar8]);
                  pcVar4 = traverse_info.file_name;
                  pcVar5 = ascii_col_sep;
                  pcVar6 = output_file_name;
                  if (traverse_info.filter[0] == (codadump_filter *)0x0) goto LAB_0010963e;
                }
                else {
                  iVar8 = strcmp(pcVar1,"-i");
                  if ((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--index"), iVar8 == 0)) {
                    show_index = 1;
                    pcVar4 = traverse_info.file_name;
                    pcVar5 = ascii_col_sep;
                    pcVar6 = output_file_name;
                    iVar8 = iVar12;
                  }
                  else {
                    iVar8 = strcmp(pcVar1,"-l");
                    if ((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--label"), iVar8 == 0)) {
                      show_label = 1;
                      pcVar4 = traverse_info.file_name;
                      pcVar5 = ascii_col_sep;
                      pcVar6 = output_file_name;
                      iVar8 = iVar12;
                    }
                    else {
                      iVar8 = strcmp(pcVar1,"-o");
                      if ((((iVar8 != 0) && (iVar8 = strcmp(pcVar1,"--output"), iVar8 != 0)) ||
                          (iVar8 = iVar12 + 1, iVar7 <= iVar8)) ||
                         (pcVar4 = traverse_info.file_name, pcVar5 = ascii_col_sep,
                         pcVar6 = argv[(ulong)uVar13 + (long)iVar8],
                         *argv[(ulong)uVar13 + (long)iVar8] == '-')) {
                        iVar8 = strcmp(pcVar1,"-q");
                        if ((iVar8 == 0) || (iVar8 = strcmp(pcVar1,"--quote_strings"), iVar8 == 0))
                        {
                          show_quotes = 1;
                          pcVar4 = traverse_info.file_name;
                          pcVar5 = ascii_col_sep;
                          pcVar6 = output_file_name;
                          iVar8 = iVar12;
                        }
                        else {
                          iVar8 = strcmp(pcVar1,"-s");
                          if (((iVar8 != 0) &&
                              (iVar8 = strcmp(pcVar1,"--column_separator"), iVar8 != 0)) ||
                             ((iVar8 = iVar12 + 1, iVar7 <= iVar8 ||
                              (pcVar4 = traverse_info.file_name,
                              pcVar5 = argv[(ulong)uVar13 + (long)iVar8], pcVar6 = output_file_name,
                              *argv[(ulong)uVar13 + (long)iVar8] == '-')))) {
                            iVar8 = strcmp(pcVar1,"-t");
                            if ((iVar8 == 0) ||
                               (iVar8 = strcmp(pcVar1,"--time_as_string"), iVar8 == 0)) {
                              show_time_as_string = 1;
                              pcVar4 = traverse_info.file_name;
                              pcVar5 = ascii_col_sep;
                              pcVar6 = output_file_name;
                              iVar8 = iVar12;
                            }
                            else {
                              iVar8 = strcmp(pcVar1,"--no_special_types");
                              pcVar5 = ascii_col_sep;
                              pcVar6 = output_file_name;
                              if (iVar8 == 0) {
                                bVar15 = false;
                                pcVar4 = traverse_info.file_name;
                                iVar8 = iVar12;
                              }
                              else if ((iVar12 != iVar7 + -1) ||
                                      (pcVar4 = pcVar1, iVar8 = iVar12, *pcVar1 == '-'))
                              goto LAB_00109684;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              output_file_name = pcVar6;
              ascii_col_sep = pcVar5;
              traverse_info.file_name = pcVar4;
              iVar12 = iVar8 + 1;
            } while (iVar12 < iVar7);
            bVar15 = !bVar15;
          }
          if ((traverse_info.file_name == (char *)0x0) || (*traverse_info.file_name == '\0'))
          goto LAB_00109625;
          iVar7 = coda_init();
          if (iVar7 != 0) goto LAB_00109648;
          coda_set_option_bypass_special_types(bVar15);
          coda_set_option_perform_boundary_checks(0);
          coda_set_option_perform_conversions(uVar11);
          traverse_info_init();
          dim_info_init();
          if ((output_file_name == (char *)0x0) ||
             (ascii_output = (FILE *)fopen(output_file_name,"w"),
             (FILE *)ascii_output != (FILE *)0x0)) {
            traverse_product();
            if (output_file_name != (char *)0x0) {
              fclose((FILE *)ascii_output);
            }
            goto LAB_0010927d;
          }
          goto LAB_00109661;
        }
        iVar7 = strcmp(pcVar1,"json");
        if (iVar7 != 0) {
          iVar7 = strcmp(pcVar1,"yaml");
          if (iVar7 != 0) {
            iVar7 = strcmp(pcVar1,"debug");
            if (iVar7 != 0) goto LAB_00109657;
            run_mode = RUN_MODE_DEBUG;
            uVar13 = iVar12 + 1;
            traverse_info.file_name = (char *)0x0;
            output_file_name = (char *)0x0;
            starting_path = (char *)0x0;
            ascii_output = _stdout;
            iVar7 = argc - uVar13;
            if (iVar7 == 0 || argc < (int)uVar13) {
              local_48 = (char *)0x0;
              local_50 = 1;
              local_38 = (char *)0x0;
              local_3c = 0;
            }
            else {
              local_50 = 1;
              iVar12 = 0;
              local_3c = 0;
              local_38 = (char *)0x0;
              local_48 = (char *)0x0;
              do {
                lVar14 = (long)iVar12;
                pcVar1 = argv[(ulong)uVar13 + lVar14];
                iVar8 = strcmp(pcVar1,"-d");
                if ((iVar8 == 0) ||
                   (iVar8 = strcmp(pcVar1,"--disable_fast_size_expressions"), iVar8 == 0)) {
                  local_50 = 0;
                  pcVar4 = traverse_info.file_name;
                  pcVar5 = output_file_name;
                  pcVar6 = starting_path;
                  iVar8 = iVar12;
                }
                else {
                  iVar8 = strcmp(pcVar1,"-o");
                  if (((((iVar8 != 0) && (iVar8 = strcmp(pcVar1,"--output"), iVar8 != 0)) ||
                       (iVar8 = iVar12 + 1, iVar7 <= iVar8)) ||
                      (pcVar4 = traverse_info.file_name, pcVar5 = argv[(ulong)uVar13 + (long)iVar8],
                      pcVar6 = starting_path, *argv[(ulong)uVar13 + (long)iVar8] == '-')) &&
                     (((iVar8 = strcmp(pcVar1,"-p"), iVar8 != 0 &&
                       (iVar8 = strcmp(pcVar1,"--path"), iVar8 != 0)) ||
                      ((iVar8 = iVar12 + 1, iVar7 <= iVar8 ||
                       (pcVar4 = traverse_info.file_name, pcVar5 = output_file_name,
                       pcVar6 = argv[(ulong)uVar13 + (long)iVar8],
                       *argv[(ulong)uVar13 + (long)iVar8] == '-')))))) {
                    iVar8 = strcmp(pcVar1,"--max_depth");
                    if (((iVar8 == 0) && (iVar8 = iVar12 + 1, iVar8 < iVar7)) &&
                       (*argv[(ulong)uVar13 + (long)iVar8] != '-')) {
                      max_depth = atoi(argv[(ulong)uVar13 + (long)iVar8]);
                      pcVar4 = traverse_info.file_name;
                      pcVar5 = output_file_name;
                      pcVar6 = starting_path;
                    }
                    else {
                      iVar8 = strcmp(pcVar1,"--open_as");
                      if ((((iVar8 == 0) && (iVar8 = iVar12 + 3, iVar8 < iVar7)) &&
                          (pcVar2 = argv[(ulong)uVar13 + lVar14 + 1], *pcVar2 != '-')) &&
                         ((pcVar3 = argv[(ulong)uVar13 + lVar14 + 2], *pcVar3 != '-' &&
                          (*argv[(ulong)uVar13 + (long)iVar8] != '-')))) {
                        local_3c = atoi(argv[(ulong)uVar13 + (long)iVar8]);
                        pcVar4 = traverse_info.file_name;
                        pcVar5 = output_file_name;
                        pcVar6 = starting_path;
                        local_48 = pcVar2;
                        local_38 = pcVar3;
                      }
                      else if ((iVar12 != iVar7 + -1) ||
                              (pcVar4 = pcVar1, pcVar5 = output_file_name, pcVar6 = starting_path,
                              iVar8 = iVar12, *pcVar1 == '-')) {
                        main_cold_3();
                        goto LAB_0010961b;
                      }
                    }
                  }
                }
                starting_path = pcVar6;
                output_file_name = pcVar5;
                traverse_info.file_name = pcVar4;
                iVar12 = iVar8 + 1;
              } while (iVar12 < iVar7);
            }
            if ((traverse_info.file_name == (char *)0x0) || (*traverse_info.file_name == '\0'))
            goto LAB_00109634;
            iVar7 = coda_init();
            if (iVar7 != 0) goto LAB_0010965c;
            coda_set_option_perform_conversions(0);
            coda_set_option_use_fast_size_expressions(local_50);
            if ((output_file_name == (char *)0x0) ||
               (ascii_output = (FILE *)fopen(output_file_name,"w"),
               (FILE *)ascii_output != (FILE *)0x0)) {
              print_debug_data(local_48,local_38,local_3c);
              goto LAB_001095d7;
            }
            goto LAB_0010966b;
          }
          run_mode = RUN_MODE_YAML;
          uVar13 = iVar12 + 1;
          bVar15 = false;
          traverse_info.file_name = (char *)0x0;
          output_file_name = (char *)0x0;
          starting_path = (char *)0x0;
          ascii_output = _stdout;
          iVar7 = argc - uVar13;
          if (iVar7 == 0 || argc < (int)uVar13) {
            local_50 = 1;
            iVar8 = 0;
          }
          else {
            local_50 = 1;
            iVar12 = 0;
            iVar8 = 0;
            bVar15 = true;
            do {
              pcVar1 = argv[(ulong)uVar13 + (long)iVar12];
              iVar9 = strcmp(pcVar1,"-a");
              iVar10 = iVar12;
              if ((iVar9 == 0) || (iVar9 = strcmp(pcVar1,"--attributes"), iVar9 == 0)) {
                iVar8 = 1;
                pcVar4 = traverse_info.file_name;
                pcVar5 = output_file_name;
                pcVar6 = starting_path;
              }
              else {
                iVar9 = strcmp(pcVar1,"-d");
                if ((iVar9 == 0) || (iVar9 = strcmp(pcVar1,"--disable_conversions"), iVar9 == 0)) {
                  local_50 = 0;
                  pcVar4 = traverse_info.file_name;
                  pcVar5 = output_file_name;
                  pcVar6 = starting_path;
                }
                else {
                  iVar10 = strcmp(pcVar1,"-o");
                  if (((((iVar10 != 0) && (iVar10 = strcmp(pcVar1,"--output"), iVar10 != 0)) ||
                       (iVar10 = iVar12 + 1, iVar7 <= iVar10)) ||
                      (pcVar4 = traverse_info.file_name, pcVar5 = argv[(ulong)uVar13 + (long)iVar10]
                      , pcVar6 = starting_path, *argv[(ulong)uVar13 + (long)iVar10] == '-')) &&
                     (((iVar10 = strcmp(pcVar1,"-p"), iVar10 != 0 &&
                       (iVar10 = strcmp(pcVar1,"--path"), iVar10 != 0)) ||
                      ((iVar10 = iVar12 + 1, iVar7 <= iVar10 ||
                       (pcVar4 = traverse_info.file_name, pcVar5 = output_file_name,
                       pcVar6 = argv[(ulong)uVar13 + (long)iVar10],
                       *argv[(ulong)uVar13 + (long)iVar10] == '-')))))) {
                    iVar10 = strcmp(pcVar1,"--no_special_types");
                    pcVar5 = output_file_name;
                    pcVar6 = starting_path;
                    if (iVar10 == 0) {
                      bVar15 = false;
                      iVar10 = iVar12;
                      pcVar4 = traverse_info.file_name;
                    }
                    else if ((iVar12 != iVar7 + -1) ||
                            (iVar10 = iVar12, pcVar4 = pcVar1, *pcVar1 == '-')) goto LAB_00109643;
                  }
                }
              }
              starting_path = pcVar6;
              output_file_name = pcVar5;
              traverse_info.file_name = pcVar4;
              iVar12 = iVar10 + 1;
            } while (iVar12 < iVar7);
            bVar15 = !bVar15;
          }
          if ((traverse_info.file_name == (char *)0x0) || (*traverse_info.file_name == '\0'))
          goto LAB_0010964d;
          iVar7 = coda_init();
          if (iVar7 == 0) {
            coda_set_option_bypass_special_types(bVar15);
            coda_set_option_perform_conversions(local_50);
            if ((output_file_name != (char *)0x0) &&
               (ascii_output = (FILE *)fopen(output_file_name,"w"),
               (FILE *)ascii_output == (FILE *)0x0)) goto LAB_0010967f;
            print_yaml_data(iVar8);
LAB_001095d7:
            if (output_file_name != (char *)0x0) {
              fclose((FILE *)ascii_output);
            }
            goto LAB_001095ed;
          }
          goto LAB_00109670;
        }
        run_mode = RUN_MODE_JSON;
        uVar13 = iVar12 + 1;
        bVar15 = false;
        traverse_info.file_name = (char *)0x0;
        output_file_name = (char *)0x0;
        starting_path = (char *)0x0;
        ascii_output = _stdout;
        iVar7 = argc - uVar13;
        if (iVar7 == 0 || argc < (int)uVar13) {
          local_50 = 1;
          iVar8 = 0;
        }
        else {
          local_50 = 1;
          iVar12 = 0;
          iVar8 = 0;
          bVar15 = true;
          do {
            pcVar1 = argv[(ulong)uVar13 + (long)iVar12];
            iVar9 = strcmp(pcVar1,"-a");
            iVar10 = iVar12;
            if ((iVar9 == 0) || (iVar9 = strcmp(pcVar1,"--attributes"), iVar9 == 0)) {
              iVar8 = 1;
              pcVar4 = traverse_info.file_name;
              pcVar5 = output_file_name;
              pcVar6 = starting_path;
            }
            else {
              iVar9 = strcmp(pcVar1,"-d");
              if ((iVar9 == 0) || (iVar9 = strcmp(pcVar1,"--disable_conversions"), iVar9 == 0)) {
                local_50 = 0;
                pcVar4 = traverse_info.file_name;
                pcVar5 = output_file_name;
                pcVar6 = starting_path;
              }
              else {
                iVar10 = strcmp(pcVar1,"-o");
                if (((((iVar10 != 0) && (iVar10 = strcmp(pcVar1,"--output"), iVar10 != 0)) ||
                     (iVar10 = iVar12 + 1, iVar7 <= iVar10)) ||
                    (pcVar4 = traverse_info.file_name, pcVar5 = argv[(ulong)uVar13 + (long)iVar10],
                    pcVar6 = starting_path, *argv[(ulong)uVar13 + (long)iVar10] == '-')) &&
                   (((iVar10 = strcmp(pcVar1,"-p"), iVar10 != 0 &&
                     (iVar10 = strcmp(pcVar1,"--path"), iVar10 != 0)) ||
                    ((iVar10 = iVar12 + 1, iVar7 <= iVar10 ||
                     (pcVar4 = traverse_info.file_name, pcVar5 = output_file_name,
                     pcVar6 = argv[(ulong)uVar13 + (long)iVar10],
                     *argv[(ulong)uVar13 + (long)iVar10] == '-')))))) {
                  iVar10 = strcmp(pcVar1,"--no_special_types");
                  pcVar5 = output_file_name;
                  pcVar6 = starting_path;
                  if (iVar10 == 0) {
                    bVar15 = false;
                    iVar10 = iVar12;
                    pcVar4 = traverse_info.file_name;
                  }
                  else if ((iVar12 != iVar7 + -1) ||
                          (iVar10 = iVar12, pcVar4 = pcVar1, *pcVar1 == '-')) goto LAB_0010962a;
                }
              }
            }
            starting_path = pcVar6;
            output_file_name = pcVar5;
            traverse_info.file_name = pcVar4;
            iVar12 = iVar10 + 1;
          } while (iVar12 < iVar7);
          bVar15 = !bVar15;
        }
        if ((traverse_info.file_name == (char *)0x0) || (*traverse_info.file_name == '\0'))
        goto LAB_00109639;
        iVar7 = coda_init();
        if (iVar7 != 0) goto LAB_00109666;
        coda_set_option_bypass_special_types(bVar15);
        coda_set_option_perform_conversions(local_50);
        if ((output_file_name == (char *)0x0) ||
           (ascii_output = (FILE *)fopen(output_file_name,"w"), (FILE *)ascii_output != (FILE *)0x0)
           ) {
          print_json_data(iVar8);
          goto LAB_001095d7;
        }
      }
      main_cold_13();
LAB_0010967a:
      main_cold_21();
LAB_0010967f:
      main_cold_9();
LAB_00109684:
      main_cold_16();
      puts("Usage:");
      puts("    codadump [-D definitionpath] list [<list options>] <product file>");
      puts("        List the contents of a product file");
      puts("        List options:");
      puts("            -c, --calc_dim");
      puts("                    calculate dimensions of all arrays");
      puts("            -d, --disable_conversions");
      puts("                    do not perform unit/value conversions");
      puts("            -f, --filter \'<filter expression>\'");
      puts("                    restrict the output to data that matches the filter");
      puts("            -t, --type");
      puts("                    show basic data type");
      puts("            -u, --unit");
      puts("                    show unit information");
      puts("            --description");
      puts("                    show description information");
      puts("            --dim_values");
      puts("                    show all possible values for a variable sized dim");
      puts("                    (implies --calc_dim)");
      puts("            --no_special_types");
      puts("                    bypass special data types from the CODA format definition -");
      puts("                    data with a special type is treated using its non-special");
      puts("                    base type");
      putchar(10);
      puts("    codadump [-D definitionpath] ascii [<ascii options>] <product file>");
      puts("        Show the contents of a product file in ascii format");
      puts("        List options:");
      puts("            -d, --disable_conversions");
      puts("                    do not perform unit/value conversions");
      puts("            -f, --filter \'<filter expression>\'");
      puts("                    restrict the output to data that matches the filter");
      puts("            -i, --index");
      puts("                    print the array index for each array element");
      puts("            -l, --label");
      puts("                    print the full name and array dims for each data block");
      puts("            -o, --output <filename>");
      puts("                    write output to specified file");
      puts("            -q, --quote_strings");
      puts("                    put \"\" around string data and \'\' around character data");
      puts("            -s, --column_separator \'<separator string>\'");
      puts("                    use the given string as column separator (default: \' \')");
      puts("            -t, --time_as_string");
      puts("                    print time as a string (instead of a floating point value)");
      puts("            --no_special_types");
      puts("                    bypass special data types from the CODA format definition -");
      puts("                    data with a special type is treated using its non-special");
      puts("                    base type");
      putchar(10);
      puts("    codadump [-D definitionpath] json [<json options>] <product file>");
      puts("        Write the contents of a product file to a JSON file");
      puts("        JSON options:");
      puts("            -a, --attributes");
      puts("                    include attributes - items with attributes will be");
      puts("                    encapsulated in a {\'attr\':<attr>,\'data\':<data>} object");
      puts("            -d, --disable_conversions");
      puts("                    do not perform unit/value conversions");
      puts("            -o, --output <filename>");
      puts("                    write output to specified file");
      puts("            -p, --path <path>");
      puts("                    path (in the form of a CODA node expression) to the");
      puts("                    location in the product where the operation should begin");
      puts("            --no_special_types");
      puts("                    bypass special data types from the CODA format definition -");
      puts("                    data with a special type is treated using its non-special");
      puts("                    base type");
      putchar(10);
      puts("    codadump [-D definitionpath] yaml [<json options>] <product file>");
      puts("        Write the contents of a product file to a YAML file");
      puts("        YAML options:");
      puts("            -a, --attributes");
      puts("                    include attributes - items with attributes will be");
      puts("                    encapsulated in a an associative array with keys \'attr\'");
      puts("                    and \'data\'");
      puts("            -d, --disable_conversions");
      puts("                    do not perform unit/value conversions");
      puts("            -o, --output <filename>");
      puts("                    write output to specified file");
      puts("            -p, --path <path>");
      puts("                    path (in the form of a CODA node expression) to the");
      puts("                    location in the product where the operation should begin");
      puts("            --no_special_types");
      puts("                    bypass special data types from the CODA format definition -");
      puts("                    data with a special type is treated using its non-special");
      puts("                    base type");
      putchar(10);
      puts("    codadump [-D definitionpath] debug [<debug options>] <product file>");
      puts("        Show the contents of a product file in sequential order for debug");
      puts("        purposes. No conversions are applied and (if applicable) for each");
      puts("        data element the file offset is given");
      puts("        Debug options:");
      puts("            -d, --disable_fast_size_expressions");
      puts("                    do not use fast-size expressions");
      puts("            -o, --output <filename>");
      puts("                    write output to specified file");
      puts("            -p, --path <path>");
      puts("                    path (in the form of a CODA node expression) to the");
      puts("                    location in the product where the operation should begin");
      puts("            --max_depth <depth>");
      puts("                    only traverse arrays/records this deep for printing items");
      puts("                    (the max depth is relative to any path provided by -p)");
      puts("            --open_as <product class> <product type> <version>");
      puts("                    force opening the product using the given product class,");
      puts("                    product type, and format version");
      putchar(10);
      puts("    codadump -h, --help");
      puts("        Show help (this text)");
      putchar(10);
      puts("    codadump -v, --version");
      puts("        Print the version number of CODA and exit");
      putchar(10);
      puts("    CODA will look for .codadef files using a definition path, which is a \':\'");
      puts("    separated (\';\' on Windows) list of paths to .codadef files and/or to");
      puts("    directories containing .codadef files.");
      puts("    By default the definition path is set to a single directory relative to");
      puts("    the tool location. A different definition path can be set via the");
      puts("    CODA_DEFINITION environment variable or via the -D option.");
      puts("    (the -D option overrides the environment variable setting).");
      iVar7 = putchar(10);
      return iVar7;
    }
  }
  print_help();
LAB_0010960f:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    int i;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    if (strcmp(argv[i], "list") == 0)
    {
        run_mode = RUN_MODE_LIST;
        i++;
        handle_list_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "ascii") == 0)
    {
        run_mode = RUN_MODE_ASCII;
        i++;
        handle_ascii_run_mode(argc - i, &argv[i]);
    }
#ifdef HAVE_HDF4
    else if (strcmp(argv[i], "hdf4") == 0)
    {
        run_mode = RUN_MODE_HDF4;
        i++;
        handle_hdf4_run_mode(argc - i, &argv[i]);
    }
#endif
    else if (strcmp(argv[i], "json") == 0)
    {
        run_mode = RUN_MODE_JSON;
        i++;
        handle_json_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "yaml") == 0)
    {
        run_mode = RUN_MODE_YAML;
        i++;
        handle_yaml_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "debug") == 0)
    {
        run_mode = RUN_MODE_DEBUG;
        i++;
        handle_debug_run_mode(argc - i, &argv[i]);
    }
    else
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    return 0;
}